

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

void Vec_QuePush(Vec_Que_t *p,int v)

{
  int iVar1;
  int v_local;
  Vec_Que_t *p_local;
  
  if (p->nCap <= p->nSize) {
    iVar1 = Abc_MaxInt(p->nSize + 1,p->nCap << 1);
    Vec_QueGrow(p,iVar1);
  }
  if (p->nCap <= v) {
    iVar1 = Abc_MaxInt(v + 1,p->nCap << 1);
    Vec_QueGrow(p,iVar1);
  }
  if (p->nCap <= p->nSize) {
    __assert_fail("p->nSize < p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                  ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  if (p->pOrder[v] != -1) {
    __assert_fail("p->pOrder[v] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                  ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  if (p->pHeap[p->nSize] == -1) {
    p->pOrder[v] = p->nSize;
    iVar1 = p->nSize;
    p->nSize = iVar1 + 1;
    p->pHeap[iVar1] = v;
    Vec_QueMoveUp(p,v);
    return;
  }
  __assert_fail("p->pHeap[p->nSize] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
}

Assistant:

static inline void Vec_QuePush( Vec_Que_t * p, int v )
{
    if ( p->nSize >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(p->nSize+1, 2*p->nCap) );
    if ( v >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(v+1, 2*p->nCap) );
    assert( p->nSize < p->nCap );
    assert( p->pOrder[v] == -1 );
    assert( p->pHeap[p->nSize] == -1 );
    p->pOrder[v] = p->nSize;
    p->pHeap[p->nSize++] = v;
    Vec_QueMoveUp( p, v );
}